

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void SplitRGBRow_C(uint8_t *src_rgb,uint8_t *dst_r,uint8_t *dst_g,uint8_t *dst_b,int width)

{
  int x;
  int width_local;
  uint8_t *dst_b_local;
  uint8_t *dst_g_local;
  uint8_t *dst_r_local;
  uint8_t *src_rgb_local;
  
  src_rgb_local = src_rgb;
  for (x = 0; x < width; x = x + 1) {
    dst_r[x] = *src_rgb_local;
    dst_g[x] = src_rgb_local[1];
    dst_b[x] = src_rgb_local[2];
    src_rgb_local = src_rgb_local + 3;
  }
  return;
}

Assistant:

void SplitRGBRow_C(const uint8_t* src_rgb,
                   uint8_t* dst_r,
                   uint8_t* dst_g,
                   uint8_t* dst_b,
                   int width) {
  int x;
  for (x = 0; x < width; ++x) {
    dst_r[x] = src_rgb[0];
    dst_g[x] = src_rgb[1];
    dst_b[x] = src_rgb[2];
    src_rgb += 3;
  }
}